

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O2

bool __thiscall
pybind11::detail::
optional_caster<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::load(optional_caster<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *this,handle src,bool convert)

{
  bool bVar1;
  undefined1 local_38 [8];
  value_conv inner_caster;
  
  if (src.m_ptr == (PyObject *)0x0) {
    bVar1 = false;
  }
  else if (src.m_ptr == (PyObject *)&_Py_NoneStruct) {
    bVar1 = true;
  }
  else {
    local_38 = (undefined1  [8])
               &inner_caster.
                super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                .value._M_string_length;
    inner_caster.
    super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    .value._M_dataplus._M_p = (pointer)0x0;
    inner_caster.
    super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    .value._M_string_length._0_1_ = 0;
    bVar1 = string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
            ::load((string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    *)local_38,src,convert);
    if (bVar1) {
      std::optional<std::__cxx11::string>::emplace<std::__cxx11::string>
                ((optional<std::__cxx11::string> *)this,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
    }
    std::__cxx11::string::~string((string *)local_38);
  }
  return bVar1;
}

Assistant:

bool load(handle src, bool convert) {
        if (!src) {
            return false;
        }
        if (src.is_none()) {
            return true;  // default-constructed value is already empty
        }
        value_conv inner_caster;
        if (!inner_caster.load(src, convert))
            return false;

        value.emplace(cast_op<typename T::value_type &&>(std::move(inner_caster)));
        return true;
    }